

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void prvTidyParseRow(TidyDocImpl *doc,Node *row,GetTokenMode mode)

{
  Lexer *pLVar1;
  Dict *pDVar2;
  Bool BVar3;
  TidyTagId TVar4;
  Node *node;
  uint code;
  Node *pNVar5;
  Node **ppNVar6;
  Node *extraout_RDX;
  Node *extraout_RDX_00;
  
  if ((row->tag->model & 1) == 0) {
    pLVar1 = doc->lexer;
    node = prvTidyGetToken(doc,IgnoreWhitespace);
    if (node != (Node *)0x0) {
      do {
        if (node->tag == row->tag) {
          if (node->type == EndTag) {
            prvTidyFreeNode(doc,node);
            row->closed = yes;
          }
          else {
            prvTidyUngetToken(doc);
          }
          FixEmptyRow(doc,row);
          return;
        }
        if (node->type == EndTag) {
          BVar3 = prvTidynodeHasCM(node,0x82);
          if ((BVar3 != no) || ((node->tag != (Dict *)0x0 && (node->tag->id == TidyTag_TABLE)))) {
            if (node->tag == (Dict *)0x0) {
              TVar4 = TidyTag_UNKNOWN;
            }
            else {
              TVar4 = node->tag->id;
            }
            for (pNVar5 = row->parent; pNVar5 != (Node *)0x0; pNVar5 = pNVar5->parent) {
              if ((pNVar5->tag != (Dict *)0x0) && (pNVar5->tag->id == TVar4)) goto LAB_0012c712;
            }
          }
          if (((node->tag == (Dict *)0x0) || (node->tag->id != TidyTag_FORM)) &&
             (BVar3 = prvTidynodeHasCM(node,0x18), BVar3 == no)) {
            pDVar2 = node->tag;
            if ((pDVar2 == (Dict *)0x0) ||
               ((pDVar2->id != TidyTag_TD && ((pDVar2 == (Dict *)0x0 || (pDVar2->id != TidyTag_TH)))
                ))) goto LAB_0012c4da;
          }
          else if ((node->tag != (Dict *)0x0) && (node->tag->id == TidyTag_FORM)) {
            *(byte *)&doc->badForm = (byte)doc->badForm | 1;
          }
          goto LAB_0012c60f;
        }
LAB_0012c4da:
        BVar3 = InsertMisc(row,node);
        if (BVar3 != no) goto LAB_0012c62d;
        if (node->tag == (Dict *)0x0) {
          if (node->type == TextNode) goto LAB_0012c503;
LAB_0012c60f:
          code = 0xd0;
LAB_0012c61d:
          prvTidyReportError(doc,row,node,code);
          prvTidyFreeNode(doc,node);
        }
        else {
          if (node->tag->id == TidyTag_TABLE) goto LAB_0012c60f;
LAB_0012c503:
          BVar3 = prvTidynodeHasCM(node,0x100);
          if (BVar3 != no) {
LAB_0012c712:
            prvTidyUngetToken(doc);
            return;
          }
          if (node->type == EndTag) goto LAB_0012c60f;
          if ((node->tag != (Dict *)0x0) && (node->tag->id == TidyTag_FORM)) {
            prvTidyUngetToken(doc);
            node = prvTidyInferredTag(doc,TidyTag_TD);
            prvTidyReportError(doc,row,node,0xd4);
LAB_0012c564:
            if (((node != (Node *)0x0) && (pDVar2 = node->tag, pDVar2 != (Dict *)0x0)) &&
               ((pDVar2->id == TidyTag_TD || ((pDVar2 != (Dict *)0x0 && (pDVar2->id == TidyTag_TH)))
                ))) {
              node->parent = row;
              pNVar5 = row->last;
              node->prev = pNVar5;
              ppNVar6 = &pNVar5->next;
              if (pNVar5 == (Node *)0x0) {
                ppNVar6 = &row->content;
              }
              *ppNVar6 = node;
              row->last = node;
              BVar3 = pLVar1->excludeBlocks;
              pLVar1->excludeBlocks = no;
              ParseTag(doc,node,IgnoreWhitespace);
              pLVar1->excludeBlocks = BVar3;
              while (pLVar1->istackbase < pLVar1->istacksize) {
                prvTidyPopInline(doc,(Node *)0x0);
              }
              goto LAB_0012c62d;
            }
            code = 0xd3;
            goto LAB_0012c61d;
          }
          BVar3 = prvTidynodeIsText(node);
          pNVar5 = extraout_RDX;
          if ((BVar3 == no) &&
             (BVar3 = prvTidynodeHasCM(node,0x18), pNVar5 = extraout_RDX_00, BVar3 == no)) {
            if ((node->tag->model & 4) == 0) goto LAB_0012c564;
            prvTidyReportError(doc,row,node,0xd3);
            MoveToHead(doc,row,node);
          }
          else {
            MoveBeforeTable((TidyDocImpl *)row,node,pNVar5);
            prvTidyReportError(doc,row,node,0xd3);
            BVar3 = pLVar1->excludeBlocks;
            pLVar1->excludeBlocks = no;
            pLVar1->exiled = yes;
            if (node->type != TextNode) {
              ParseTag(doc,node,IgnoreWhitespace);
            }
            pLVar1->exiled = no;
            pLVar1->excludeBlocks = BVar3;
          }
        }
LAB_0012c62d:
        node = prvTidyGetToken(doc,IgnoreWhitespace);
      } while (node != (Node *)0x0);
    }
  }
  return;
}

Assistant:

void TY_(ParseRow)(TidyDocImpl* doc, Node *row, GetTokenMode ARG_UNUSED(mode))
{
    Lexer* lexer = doc->lexer;
    Node *node;
    Bool exclude_state;

    if (row->tag->model & CM_EMPTY)
        return;

    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        if (node->tag == row->tag)
        {
            if (node->type == EndTag)
            {
                TY_(FreeNode)( doc, node);
                row->closed = yes;
                FixEmptyRow( doc, row);
                return;
            }

            /* New row start implies end of current row */
            TY_(UngetToken)( doc );
            FixEmptyRow( doc, row);
            return;
        }

        /* 
          if this is the end tag for an ancestor element
          then infer end tag for this element
        */
        if ( node->type == EndTag )
        {
            if ( (TY_(nodeHasCM)(node, CM_HTML|CM_TABLE) || nodeIsTABLE(node))
                 && DescendantOf(row, TagId(node)) )
            {
                TY_(UngetToken)( doc );
                return;
            }

            if ( nodeIsFORM(node) || TY_(nodeHasCM)(node, CM_BLOCK|CM_INLINE) )
            {
                if ( nodeIsFORM(node) )
                    BadForm( doc );

                TY_(ReportError)(doc, row, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }

            if ( nodeIsTD(node) || nodeIsTH(node) )
            {
                TY_(ReportError)(doc, row, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }
        }

        /* deal with comments etc. */
        if (InsertMisc(row, node))
            continue;

        /* discard unknown tags */
        if (node->tag == NULL && node->type != TextNode)
        {
            TY_(ReportError)(doc, row, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /* discard unexpected <table> element */
        if ( nodeIsTABLE(node) )
        {
            TY_(ReportError)(doc, row, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /* THEAD, TFOOT or TBODY */
        if ( TY_(nodeHasCM)(node, CM_ROWGRP) )
        {
            TY_(UngetToken)( doc );
            return;
        }

        if (node->type == EndTag)
        {
            TY_(ReportError)(doc, row, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /*
          if text or inline or block move before table
          if head content move to head
        */

        if (node->type != EndTag)
        {
            if ( nodeIsFORM(node) )
            {
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_TD);
                TY_(ReportError)(doc, row, node, MISSING_STARTTAG);
            }
            else if ( TY_(nodeIsText)(node)
                      || TY_(nodeHasCM)(node, CM_BLOCK | CM_INLINE) )
            {
                MoveBeforeTable( doc, row, node );
                TY_(ReportError)(doc, row, node, TAG_NOT_ALLOWED_IN);
                lexer->exiled = yes;
                exclude_state = lexer->excludeBlocks;
                lexer->excludeBlocks = no;

                if (node->type != TextNode)
                    ParseTag( doc, node, IgnoreWhitespace);

                lexer->exiled = no;
                lexer->excludeBlocks = exclude_state;
                continue;
            }
            else if (node->tag->model & CM_HEAD)
            {
                TY_(ReportError)(doc, row, node, TAG_NOT_ALLOWED_IN);
                MoveToHead( doc, row, node);
                continue;
            }
        }

        if ( !(nodeIsTD(node) || nodeIsTH(node)) )
        {
            TY_(ReportError)(doc, row, node, TAG_NOT_ALLOWED_IN);
            TY_(FreeNode)( doc, node);
            continue;
        }
        
        /* node should be <TD> or <TH> */
        TY_(InsertNodeAtEnd)(row, node);
        exclude_state = lexer->excludeBlocks;
        lexer->excludeBlocks = no;
        ParseTag( doc, node, IgnoreWhitespace);
        lexer->excludeBlocks = exclude_state;

        /* pop inline stack */

        while ( lexer->istacksize > lexer->istackbase )
            TY_(PopInline)( doc, NULL );
    }

}